

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O1

PolicyPureVector * __thiscall
PolicyPureVector::operator=(PolicyPureVector *this,PolicyPureVector *o)

{
  Index IVar1;
  
  if (this != o) {
    *(undefined4 *)&this->field_0x10 = *(undefined4 *)&o->field_0x10;
    *(undefined8 *)&this->field_0x8 = *(undefined8 *)&o->field_0x8;
    *(undefined8 *)&this->field_0x18 = *(undefined8 *)&o->field_0x18;
    boost::shared_ptr<const_Interface_ProblemToPolicyDiscrete>::operator=
              ((shared_ptr<const_Interface_ProblemToPolicyDiscrete> *)&this->field_0x20,
               (shared_ptr<const_Interface_ProblemToPolicyDiscrete> *)&o->field_0x20);
    IVar1 = o->_m_agentI;
    *(undefined4 *)&this->field_0x30 = *(undefined4 *)&o->field_0x30;
    this->_m_agentI = IVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->_m_domainToActionIndices,&o->_m_domainToActionIndices);
  }
  return this;
}

Assistant:

PolicyPureVector& PolicyPureVector::operator= (const PolicyPureVector& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...
    PolicyDiscretePure::operator= ( o );
    _m_agentI = o._m_agentI;
    _m_domainToActionIndices = o._m_domainToActionIndices;

    return *this;
}